

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O0

int ASN1_TYPE_get(ASN1_TYPE *a)

{
  int iVar1;
  int local_24;
  int local_20;
  ASN1_TYPE *a_local;
  
  iVar1 = a->type;
  if ((iVar1 == 1) || (iVar1 == 5)) {
    a_local._4_4_ = a->type;
  }
  else if (iVar1 == 6) {
    if ((a->value).ptr == (char *)0x0) {
      local_20 = 0;
    }
    else {
      local_20 = a->type;
    }
    a_local._4_4_ = local_20;
  }
  else {
    if ((a->value).ptr == (char *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = a->type;
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ASN1_TYPE_get(const ASN1_TYPE *a) {
  switch (a->type) {
    case V_ASN1_NULL:
    case V_ASN1_BOOLEAN:
      return a->type;
    case V_ASN1_OBJECT:
      return a->value.object != NULL ? a->type : 0;
    default:
      return a->value.asn1_string != NULL ? a->type : 0;
  }
}